

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevmousehandler.cpp
# Opt level: O3

void __thiscall QEvdevMouseHandler::readMouseData(QEvdevMouseHandler *this)

{
  short sVar1;
  byte bVar2;
  int iVar3;
  ssize_t sVar4;
  int *piVar5;
  uint uVar6;
  undefined4 uVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  uint *puVar11;
  bool bVar12;
  bool bVar13;
  long in_FS_OFFSET;
  input_event buffer [32];
  ulong local_350;
  undefined1 local_348 [20];
  uint local_334 [187];
  void *local_48;
  ulong *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  memset(local_348,0xaa,0x300);
  uVar10 = 0;
LAB_00124ec2:
  do {
    iVar3 = *(int *)(this + 0x28);
    do {
      sVar4 = read(iVar3,local_348 + uVar10,0x300 - uVar10);
      if (sVar4 != -1) {
        iVar3 = (int)sVar4;
        if (iVar3 == 0) {
          readMouseData();
          goto LAB_00125155;
        }
        if (-1 < iVar3) {
          uVar9 = (int)uVar10 + iVar3;
          uVar10 = (ulong)uVar9;
          if (0xaaaaaaa < (uVar9 * -0x55555555 >> 3 | uVar9 * 0x60000000)) goto LAB_00124ec2;
          if (uVar9 < 0x18) goto LAB_00125155;
          uVar10 = uVar10 / 0x18;
          puVar11 = local_334;
          bVar13 = false;
          bVar12 = false;
          bVar2 = 0;
          goto LAB_00124f62;
        }
        piVar5 = __errno_location();
        iVar8 = *piVar5;
        break;
      }
      piVar5 = __errno_location();
      iVar8 = *piVar5;
    } while (iVar8 == 4);
  } while ((iVar8 == 4) || (iVar8 == 0xb));
  readMouseData();
  goto LAB_00125155;
LAB_00124f62:
  do {
    switch((short)puVar11[-1]) {
    case 0:
      if (*(short *)((long)puVar11 + -2) == 0) {
        if (bVar12) {
          sendMouseEvent(this);
          bVar2 = 0;
        }
        else if (bVar13) {
          *(undefined4 *)(this + 0x54) = 5;
          if (this[0x49] == (QEvdevMouseHandler)0x0) {
            sendMouseEvent(this);
          }
          else {
            bVar2 = 1;
          }
        }
        bVar12 = false;
        bVar13 = false;
      }
      break;
    case 1:
      sVar1 = *(short *)((long)puVar11 + -2);
      if (sVar1 == 0x14a) {
        this[0x5c] = (QEvdevMouseHandler)0x1;
      }
      else if ((ushort)(sVar1 - 0x110U) < 0x11) {
        uVar9 = 0;
        if ((ushort)(sVar1 - 0x110U) < 0x10) {
          uVar9 = *(uint *)(&DAT_00146aa0 + (ulong)(ushort)(sVar1 - 0x110U) * 4);
        }
        if (*puVar11 == 0) {
          uVar6 = ~uVar9 & *(uint *)(this + 0x4c);
          uVar7 = 3;
        }
        else {
          uVar6 = *(uint *)(this + 0x4c) | uVar9;
          uVar7 = 2;
        }
        *(uint *)(this + 0x4c) = uVar6;
        *(uint *)(this + 0x50) = uVar9;
        *(undefined4 *)(this + 0x54) = uVar7;
        bVar12 = true;
      }
      break;
    case 2:
      sVar1 = *(short *)((long)puVar11 + -2);
      if (sVar1 == 1) {
        *(uint *)(this + 0x3c) = *(int *)(this + 0x3c) + *puVar11;
      }
      else {
        if (sVar1 != 0) {
          if ((sVar1 == 8) && (this[0x4a] == (QEvdevMouseHandler)0x0)) {
            uVar9 = *puVar11 * 0x78;
LAB_001250a5:
            local_350 = (ulong)uVar9 << 0x20;
          }
          else {
            if (sVar1 == 0xb) {
              uVar9 = *puVar11;
              goto LAB_001250a5;
            }
            if ((sVar1 == 6) && (this[0x4b] == (QEvdevMouseHandler)0x0)) {
              local_350 = (ulong)(*puVar11 * -0x78);
            }
            else {
              if (sVar1 != 0xc) break;
              local_350 = (ulong)-*puVar11;
            }
          }
          local_48 = (void *)0x0;
          local_40 = &local_350;
          QMetaObject::activate((QObject *)this,&staticMetaObject,1,&local_48);
          break;
        }
        *(uint *)(this + 0x38) = *(int *)(this + 0x38) + *puVar11;
      }
LAB_00125061:
      bVar13 = true;
      break;
    case 3:
      if (*(short *)((long)puVar11 + -2) == 1) {
        if (*(uint *)(this + 0x3c) != *puVar11) {
          *(uint *)(this + 0x3c) = *puVar11;
          goto LAB_00125061;
        }
      }
      else if ((*(short *)((long)puVar11 + -2) == 0) && (*(uint *)(this + 0x38) != *puVar11)) {
        *(uint *)(this + 0x38) = *puVar11;
        goto LAB_00125061;
      }
    }
    puVar11 = puVar11 + 6;
    uVar10 = uVar10 - 1;
  } while (uVar10 != 0);
  if ((((byte)this[0x49] & bVar2) != 0) &&
     (*(int *)(this + 0x58) <
      (*(int *)(this + 0x3c) - *(int *)(this + 0x44)) *
      (*(int *)(this + 0x3c) - *(int *)(this + 0x44)) +
      (*(int *)(this + 0x38) - *(int *)(this + 0x40)) *
      (*(int *)(this + 0x38) - *(int *)(this + 0x40)))) {
    sendMouseEvent(this);
  }
LAB_00125155:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QEvdevMouseHandler::readMouseData()
{
    struct ::input_event buffer[32];
    int n = 0;
    bool posChanged = false, btnChanged = false;
    bool pendingMouseEvent = false;
    forever {
        int result = QT_READ(m_fd, reinterpret_cast<char *>(buffer) + n, sizeof(buffer) - n);

        if (result == 0) {
            qWarning("evdevmouse: Got EOF from the input device");
            return;
        } else if (result < 0) {
            if (errno != EINTR && errno != EAGAIN) {
                qErrnoWarning(errno, "evdevmouse: Could not read from input device");
                // If the device got disconnected, stop reading, otherwise we get flooded
                // by the above error over and over again.
                if (errno == ENODEV) {
                    delete m_notify;
                    m_notify = nullptr;
                    qt_safe_close(m_fd);
                    m_fd = -1;
                }
                return;
            }
        } else {
            n += result;
            if (n % sizeof(buffer[0]) == 0)
                break;
        }
    }